

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

uint32_t __thiscall wasm::EffectAnalyzer::getSideEffects(EffectAnalyzer *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  uint local_14;
  uint32_t effects;
  EffectAnalyzer *this_local;
  
  local_14 = 0;
  if (((this->branchesOut & 1U) != 0) || (bVar1 = hasExternalBreakTargets(this), bVar1)) {
    local_14 = 1;
  }
  if ((this->calls & 1U) != 0) {
    local_14 = local_14 | 2;
  }
  sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                    (&this->localsRead);
  if (sVar2 != 0) {
    local_14 = local_14 | 4;
  }
  sVar2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                    (&this->localsWritten);
  if (sVar2 != 0) {
    local_14 = local_14 | 8;
  }
  sVar3 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::size
                    (&this->mutableGlobalsRead);
  if (sVar3 != 0) {
    local_14 = local_14 | 0x10;
  }
  sVar3 = std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::size
                    (&this->globalsWritten);
  if (sVar3 != 0) {
    local_14 = local_14 | 0x20;
  }
  if ((this->readsMemory & 1U) != 0) {
    local_14 = local_14 | 0x40;
  }
  if ((this->writesMemory & 1U) != 0) {
    local_14 = local_14 | 0x80;
  }
  if ((this->readsTable & 1U) != 0) {
    local_14 = local_14 | 0x100;
  }
  if ((this->writesTable & 1U) != 0) {
    local_14 = local_14 | 0x200;
  }
  if ((this->implicitTrap & 1U) != 0) {
    local_14 = local_14 | 0x400;
  }
  if ((this->trapsNeverHappen & 1U) != 0) {
    local_14 = local_14 | 0x4000;
  }
  if ((this->isAtomic & 1U) != 0) {
    local_14 = local_14 | 0x800;
  }
  if ((this->throws_ & 1U) != 0) {
    local_14 = local_14 | 0x1000;
  }
  if ((this->danglingPop & 1U) != 0) {
    local_14 = local_14 | 0x2000;
  }
  return local_14;
}

Assistant:

uint32_t getSideEffects() const {
    uint32_t effects = 0;
    if (branchesOut || hasExternalBreakTargets()) {
      effects |= SideEffects::Branches;
    }
    if (calls) {
      effects |= SideEffects::Calls;
    }
    if (localsRead.size() > 0) {
      effects |= SideEffects::ReadsLocal;
    }
    if (localsWritten.size() > 0) {
      effects |= SideEffects::WritesLocal;
    }
    if (mutableGlobalsRead.size()) {
      effects |= SideEffects::ReadsGlobal;
    }
    if (globalsWritten.size() > 0) {
      effects |= SideEffects::WritesGlobal;
    }
    if (readsMemory) {
      effects |= SideEffects::ReadsMemory;
    }
    if (writesMemory) {
      effects |= SideEffects::WritesMemory;
    }
    if (readsTable) {
      effects |= SideEffects::ReadsTable;
    }
    if (writesTable) {
      effects |= SideEffects::WritesTable;
    }
    if (implicitTrap) {
      effects |= SideEffects::ImplicitTrap;
    }
    if (trapsNeverHappen) {
      effects |= SideEffects::TrapsNeverHappen;
    }
    if (isAtomic) {
      effects |= SideEffects::IsAtomic;
    }
    if (throws_) {
      effects |= SideEffects::Throws;
    }
    if (danglingPop) {
      effects |= SideEffects::DanglingPop;
    }
    return effects;
  }